

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clSetKernelArgMemPointerINTEL(cl_kernel kernel,cl_uint arg_index,void *arg_value)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _func_cl_int_cl_kernel_cl_uint_void_ptr *p_Var3;
  ulong enqueueCounter;
  CLIntercept *this;
  uint errorCode;
  cl_platform_id p_Var4;
  mapped_type *pmVar5;
  time_point end;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  time_point local_58;
  cl_context context;
  _cl_context local_40 [16];
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x30;
  }
  context = (cl_context)0x0;
  (*(g_pIntercept->m_Dispatch).clGetKernelInfo)(kernel,0x1193,8,&context,(size_t *)0x0);
  p_Var4 = CLIntercept::getPlatform(this,context);
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0;
      p_Var7 = (&p_Var7->_M_left)[*(cl_platform_id *)(p_Var7 + 1) < p_Var4]) {
    if (*(cl_platform_id *)(p_Var7 + 1) >= p_Var4) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var7 = p_Var6, p_Var4 < *(cl_platform_id *)(p_Var6 + 1))) {
    p_Var7 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    context = (cl_context)0x0;
    pmVar5 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)&context);
  }
  else {
    pmVar5 = (mapped_type *)&p_Var7[1]._M_parent;
  }
  p_Var3 = pmVar5->clSetKernelArgMemPointerINTEL;
  if (p_Var3 == (_func_cl_int_cl_kernel_cl_uint_void_ptr *)0x0) goto LAB_0013bb10;
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (this,"clSetKernelArgMemPointerINTEL",enqueueCounter,kernel,
               "kernel = %p, index = %u, value = %p",kernel,(ulong)arg_index,arg_value);
  }
  if ((this->m_Config).USMChecking == true) {
    CLIntercept::checkKernelArgUSMPointer(this,kernel,arg_value);
  }
  if (((((this->m_Config).DumpBuffersBeforeEnqueue != false) ||
       ((this->m_Config).DumpBuffersAfterEnqueue != false)) ||
      ((this->m_Config).InjectBuffers != false)) ||
     (((this->m_Config).InjectImages != false || ((this->m_Config).CaptureReplay == true)))) {
    CLIntercept::setKernelArgUSMPointer(this,kernel,arg_index,arg_value);
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_58.__d.__r = (duration)0;
  }
  else {
    local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pmVar5->clSetKernelArgMemPointerINTEL)(kernel,arg_index,arg_value);
  pmVar5 = (mapped_type *)(ulong)errorCode;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      context = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&context,"");
      CLIntercept::updateHostTimingStats
                (this,"clSetKernelArgMemPointerINTEL",(string *)&context,local_58,end);
      if (context != local_40) {
        operator_delete(context);
      }
    }
  }
  bVar2 = (this->m_Config).ErrorLogging;
  if ((bVar2 == false) && ((this->m_Config).ErrorAssert == false)) {
    if ((errorCode != 0) && ((this->m_Config).NoErrors != false)) {
LAB_0013ba5b:
      if (bVar2 != false) {
        CLIntercept::logError(this,"clSetKernelArgMemPointerINTEL",errorCode);
      }
      if ((this->m_Config).ErrorAssert == true) {
        raise(5);
      }
      if ((this->m_Config).NoErrors != false) {
        pmVar5 = (mapped_type *)0x0;
      }
    }
  }
  else {
    if (errorCode != 0) goto LAB_0013ba5b;
    pmVar5 = (mapped_type *)0x0;
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clSetKernelArgMemPointerINTEL",(cl_int)pmVar5,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    context = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&context,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clSetKernelArgMemPointerINTEL",(string *)&context,false,0,local_58,end);
    if (context != local_40) {
      operator_delete(context);
    }
  }
LAB_0013bb10:
  if (p_Var3 == (_func_cl_int_cl_kernel_cl_uint_void_ptr *)0x0) {
    return -0x30;
  }
  return (cl_int)pmVar5;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clSetKernelArgMemPointerINTEL(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg_value)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(kernel);
        if( dispatchX.clSetKernelArgMemPointerINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "kernel = %p, index = %u, value = %p",
                kernel,
                arg_index,
                arg_value );
            CHECK_KERNEL_ARG_USM_POINTER( kernel, arg_value );
            SET_KERNEL_ARG_USM_POINTER( kernel, arg_index, arg_value );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clSetKernelArgMemPointerINTEL(
                kernel,
                arg_index,
                arg_value );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_KERNEL);
}